

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

void brotli::InitialEntropyCodes<brotli::Histogram<704>,unsigned_short>
               (unsigned_short *data,size_t length,size_t literals_per_histogram,
               size_t max_histograms,size_t stride,
               vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *vec)

{
  ulong uVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int local_b7c;
  Histogram<704> histo;
  
  uVar5 = 0;
  uVar4 = length / literals_per_histogram + 1;
  if (max_histograms <= uVar4) {
    uVar4 = max_histograms;
  }
  local_b7c = 7;
  for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
    uVar1 = uVar5 / uVar4;
    if (uVar3 != 0) {
      uVar2 = (ulong)(uint)(local_b7c * 0x41a7);
      if (local_b7c == 0) {
        uVar2 = 1;
      }
      uVar1 = uVar1 + uVar2 % (length / uVar4);
      local_b7c = (int)uVar2;
    }
    if (length <= uVar1 + stride) {
      uVar1 = ~stride + length;
    }
    memset(&histo,0,0xb08);
    histo.bit_cost_ = INFINITY;
    Histogram<704>::Add<unsigned_short>(&histo,data + uVar1,stride);
    std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::push_back
              (vec,&histo);
    uVar5 = uVar5 + length;
  }
  return;
}

Assistant:

void InitialEntropyCodes(const DataType* data, size_t length,
                         size_t literals_per_histogram,
                         size_t max_histograms,
                         size_t stride,
                         std::vector<HistogramType>* vec) {
  size_t total_histograms = length / literals_per_histogram + 1;
  if (total_histograms > max_histograms) {
    total_histograms = max_histograms;
  }
  unsigned int seed = 7;
  size_t block_length = length / total_histograms;
  for (size_t i = 0; i < total_histograms; ++i) {
    size_t pos = length * i / total_histograms;
    if (i != 0) {
      pos += MyRand(&seed) % block_length;
    }
    if (pos + stride >= length) {
      pos = length - stride - 1;
    }
    HistogramType histo;
    histo.Add(data + pos, stride);
    vec->push_back(histo);
  }
}